

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator-=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Fad<double> *pFVar8;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  Fad<double> *pFVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  value_type vVar19;
  
  pFVar8 = (x->fadexpr_).left_;
  pFVar9 = (x->fadexpr_).right_;
  uVar4 = (pFVar8->dx_).num_elts;
  pFVar10 = (pFVar9->fadexpr_).left_;
  pFVar11 = (pFVar9->fadexpr_).right_;
  uVar5 = (pFVar10->dx_).num_elts;
  uVar6 = (pFVar11->dx_).num_elts;
  uVar18 = uVar6;
  if ((int)uVar6 < (int)uVar5) {
    uVar18 = uVar5;
  }
  if ((int)uVar18 < (int)uVar4) {
    uVar18 = uVar4;
  }
  if (uVar18 != 0) {
    uVar7 = (this->dx_).num_elts;
    uVar17 = (ulong)uVar7;
    if (uVar17 == 0) {
      (this->dx_).num_elts = uVar18;
      uVar16 = (ulong)uVar18;
      uVar17 = 0xffffffffffffffff;
      if (-1 < (int)uVar18) {
        uVar17 = uVar16 * 8;
      }
      pdVar15 = (double *)operator_new__(uVar17);
      (this->dx_).ptr_to_data = pdVar15;
      if ((((pFVar8->dx_).num_elts == 0) || ((pFVar10->dx_).num_elts == 0)) ||
         ((pFVar11->dx_).num_elts == 0)) {
        if (0 < (int)uVar18) {
          uVar17 = 0;
          do {
            vVar19 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                     ::dx(&x->fadexpr_,(int)uVar17);
            pdVar15[uVar17] = -vVar19;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
      }
      else if (0 < (int)uVar18) {
        pdVar12 = (pFVar8->dx_).ptr_to_data;
        pdVar13 = (pFVar10->dx_).ptr_to_data;
        pdVar14 = (pFVar11->dx_).ptr_to_data;
        dVar1 = pFVar10->val_;
        dVar2 = pFVar8->val_;
        dVar3 = pFVar11->val_;
        uVar17 = 0;
        do {
          pdVar15[uVar17] =
               -(pdVar12[uVar17] * (dVar1 - dVar3) + (pdVar13[uVar17] - pdVar14[uVar17]) * dVar2);
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
    }
    else {
      pdVar15 = (this->dx_).ptr_to_data;
      if ((uVar5 == 0 || uVar4 == 0) || uVar6 == 0) {
        if (0 < (int)uVar7) {
          uVar16 = 0;
          do {
            vVar19 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
                     ::dx(&x->fadexpr_,(int)uVar16);
            pdVar15[uVar16] = pdVar15[uVar16] - vVar19;
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
      }
      else if (0 < (int)uVar7) {
        pdVar12 = (pFVar8->dx_).ptr_to_data;
        pdVar13 = (pFVar10->dx_).ptr_to_data;
        pdVar14 = (pFVar11->dx_).ptr_to_data;
        uVar16 = 0;
        do {
          pdVar15[uVar16] =
               pdVar15[uVar16] -
               ((pFVar10->val_ - pFVar11->val_) * pdVar12[uVar16] +
               (pdVar13[uVar16] - pdVar14[uVar16]) * pFVar8->val_);
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
    }
  }
  pFVar9 = (x->fadexpr_).right_;
  this->val_ = this->val_ -
               (((pFVar9->fadexpr_).left_)->val_ - ((pFVar9->fadexpr_).right_)->val_) *
               ((x->fadexpr_).left_)->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator-= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<sz; ++i)
	  dxp[i] -= x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] -= x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<xsz; ++i)
	  dxp[i] = -x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = -x.dx(i);
    }
  }

  val_ -= x.val();


  return *this;
}